

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToDisplayBack(ImGuiWindow_conflict *window)

{
  ImGuiContext_conflict *pIVar1;
  ImGuiWindow_conflict **ppIVar2;
  ImGuiWindow_conflict **__src;
  int local_1c;
  int i;
  ImGuiContext_conflict *g;
  ImGuiWindow_conflict *window_local;
  
  pIVar1 = GImGui;
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&GImGui->Windows,0);
  if (*ppIVar2 != window) {
    for (local_1c = 0; local_1c < (pIVar1->Windows).Size; local_1c = local_1c + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_1c);
      if (*ppIVar2 == window) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,1);
        __src = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,0);
        memmove(ppIVar2,__src,(long)local_1c << 3);
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,0);
        *ppIVar2 = window;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBack(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.Windows[0] == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[1], &g.Windows[0], (size_t)i * sizeof(ImGuiWindow*));
            g.Windows[0] = window;
            break;
        }
}